

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

void __thiscall
ParamEntry::ParamEntry
          (ParamEntry *this,type_metatype t,int4 grp,int4 grpsize,Address *loc,int4 sz,int4 mnsz,
          int4 align,bool normalstack)

{
  AddrSpace *pAVar1;
  uintb offset;
  int iVar2;
  JoinRecord *pJVar3;
  
  this->flags = 0;
  this->type = t;
  this->group = grp;
  this->groupsize = grpsize;
  pAVar1 = loc->base;
  this->spaceid = pAVar1;
  offset = loc->offset;
  this->addressbase = offset;
  this->size = sz;
  this->minsize = mnsz;
  this->alignment = align;
  if (align == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = sz / align;
  }
  this->numslots = iVar2;
  if (!normalstack) {
    this->flags = 2;
  }
  if (pAVar1->type == IPTR_JOIN) {
    pJVar3 = AddrSpaceManager::findJoin(pAVar1->manage,offset);
  }
  else {
    pJVar3 = (JoinRecord *)0x0;
  }
  this->joinrec = pJVar3;
  return;
}

Assistant:

ParamEntry::ParamEntry(type_metatype t,int4 grp,int4 grpsize,const Address &loc,int4 sz,int4 mnsz,int4 align,bool normalstack)

{
  flags = 0;
  type = t;
  group = grp;
  groupsize = grpsize;
  spaceid = loc.getSpace();
  addressbase = loc.getOffset();
  size = sz;
  minsize = mnsz;
  alignment = align;
  if (alignment != 0)
    numslots = size / alignment;
  else
    numslots = 1;
  if (!normalstack)
    flags |= reverse_stack;
  resolveJoin();
}